

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPrimitiveDefaults::~RepeatedPrimitiveDefaults
          (RepeatedPrimitiveDefaults *this)

{
  RepeatedField<bool>::~RepeatedField(&this->default_repeated_field_bool_);
  RepeatedField<float>::~RepeatedField(&this->default_repeated_field_float_);
  RepeatedField<double>::~RepeatedField(&this->default_repeated_field_double_);
  RepeatedField<unsigned_long>::~RepeatedField(&this->default_repeated_field_uint64_);
  RepeatedField<unsigned_int>::~RepeatedField(&this->default_repeated_field_uint32_);
  RepeatedField<long>::~RepeatedField(&this->default_repeated_field_int64_);
  RepeatedField<int>::~RepeatedField(&this->default_repeated_field_int32_);
  return;
}

Assistant:

class PROTOBUF_EXPORT RepeatedPrimitiveDefaults {
 private:
  template <typename Type>
  friend class RepeatedPrimitiveTypeTraits;
  static const RepeatedPrimitiveDefaults* default_instance();
  RepeatedField<int32> default_repeated_field_int32_;
  RepeatedField<int64> default_repeated_field_int64_;
  RepeatedField<uint32> default_repeated_field_uint32_;
  RepeatedField<uint64> default_repeated_field_uint64_;
  RepeatedField<double> default_repeated_field_double_;
  RepeatedField<float> default_repeated_field_float_;
  RepeatedField<bool> default_repeated_field_bool_;
}